

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

Bigint * d2b(U *d,int *e,int *bits)

{
  int iVar1;
  int local_4c;
  uint local_48;
  int i;
  uint32 z;
  uint32 y;
  uint32 *x;
  int k;
  int de;
  Bigint *b;
  int *bits_local;
  int *e_local;
  U *d_local;
  
  b = (Bigint *)bits;
  bits_local = e;
  e_local = (int *)d;
  _k = (U *)Balloc(1);
  if (_k == (U *)0x0) {
    d_local = (U *)0x0;
  }
  else {
    _z = _k + 3;
    local_48 = e_local[1] & 0xfffff;
    e_local[1] = e_local[1] & 0x7fffffff;
    x._4_4_ = (uint)e_local[1] >> 0x14;
    if (x._4_4_ != 0) {
      local_48 = local_48 | 0x100000;
    }
    i = *e_local;
    if (i == 0) {
      iVar1 = lo0bits(&local_48);
      _z->L[0] = local_48;
      *(int *)((long)_k + 0x14) = 1;
      local_4c = 1;
      x._0_4_ = iVar1 + 0x20;
    }
    else {
      x._0_4_ = lo0bits((uint32 *)&i);
      if ((int)x == 0) {
        _z->L[0] = i;
      }
      else {
        _z->L[0] = i | local_48 << (0x20 - (byte)(int)x & 0x1f);
        local_48 = local_48 >> ((byte)(int)x & 0x1f);
      }
      _z->L[1] = local_48;
      local_4c = 1;
      if (local_48 != 0) {
        local_4c = 2;
      }
      *(int *)((long)_k + 0x14) = local_4c;
    }
    if (x._4_4_ == 0) {
      *bits_local = (int)x + -0x432;
      iVar1 = hi0bits(_z->L[local_4c + -1]);
      *(int *)&b->next = local_4c * 0x20 - iVar1;
    }
    else {
      *bits_local = (x._4_4_ - 0x433) + (int)x;
      *(int *)&b->next = 0x35 - (int)x;
    }
    d_local = _k;
  }
  return (Bigint *)d_local;
}

Assistant:

static Bigint *
d2b(U *d, int *e, int *bits)
{
    Bigint *b;
    int de, k;
    ULong *x, y, z;
    int i;

    b = Balloc(1);
    if (b == NULL)
        return NULL;
    x = b->x;

    z = word0(d) & Frac_mask;
    word0(d) &= 0x7fffffff;   /* clear sign bit, which we ignore */
    if ((de = (int)(word0(d) >> Exp_shift)))
        z |= Exp_msk1;
    if ((y = word1(d))) {
        if ((k = lo0bits(&y))) {
            x[0] = y | z << (32 - k);
            z >>= k;
        }
        else
            x[0] = y;
        i =
            b->wds = (x[1] = z) ? 2 : 1;
    }
    else {
        k = lo0bits(&z);
        x[0] = z;
        i =
            b->wds = 1;
        k += 32;
    }
    if (de) {
        *e = de - Bias - (P-1) + k;
        *bits = P - k;
    }
    else {
        *e = de - Bias - (P-1) + 1 + k;
        *bits = 32*i - hi0bits(x[i-1]);
    }
    return b;
}